

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O3

QWeakPointer<QObject> __thiscall
QtSharedPointer::weakPointerFromVariant_internal(QtSharedPointer *this,QVariant *variant)

{
  PrivateShared *pPVar1;
  QObject *pQVar2;
  QWeakPointer<QObject> QVar3;
  
  if (((variant->d).field_0x18 & 1) != 0) {
    pPVar1 = (variant->d).data.shared;
    variant = (QVariant *)
              ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                      _q_value.super___atomic_base<int> + (long)pPVar1->offset);
  }
  pPVar1 = (variant->d).data.shared;
  *(PrivateShared **)this = pPVar1;
  pQVar2 = *(QObject **)((long)&(variant->d).data + 8);
  *(QObject **)(this + 8) = pQVar2;
  if (pPVar1 != (PrivateShared *)0x0) {
    LOCK();
    (pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> + 1);
    UNLOCK();
  }
  QVar3.value = pQVar2;
  QVar3.d = (Data *)this;
  return QVar3;
}

Assistant:

QWeakPointer<QObject> QtSharedPointer::weakPointerFromVariant_internal(const QVariant &variant)
{
    Q_ASSERT(variant.metaType().flags() & QMetaType::WeakPointerToQObject ||
             variant.metaType().flags() & QMetaType::TrackingPointerToQObject);
    return *reinterpret_cast<const QWeakPointer<QObject>*>(variant.constData());
}